

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDomain.cpp
# Opt level: O3

void __thiscall
HighsDomain::CutpoolPropagation::markPropagateCut(CutpoolPropagation *this,HighsInt cut)

{
  pointer pHVar1;
  iterator __position;
  long lVar2;
  pointer puVar3;
  int local_14;
  
  lVar2 = (long)cut;
  puVar3 = (this->propagatecutflags_).
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((puVar3[lVar2] == '\0') &&
     (((this->activitycutsinf_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_start[lVar2] == 1 ||
      (pHVar1 = (this->activitycuts_).
                super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
                super__Vector_impl_data._M_start,
      (this->cutpool->rhs_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[lVar2] - (pHVar1[lVar2].hi + pHVar1[lVar2].lo) <=
      (this->capacityThreshold_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[lVar2])))) {
    __position._M_current =
         (this->propagatecutinds_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->propagatecutinds_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      local_14 = cut;
      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                ((vector<int,std::allocator<int>> *)&this->propagatecutinds_,__position,&local_14);
      lVar2 = (long)local_14;
      puVar3 = (this->propagatecutflags_).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
    }
    else {
      *__position._M_current = cut;
      (this->propagatecutinds_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
    puVar3[lVar2] = puVar3[lVar2] | 1;
  }
  return;
}

Assistant:

void HighsDomain::CutpoolPropagation::markPropagateCut(HighsInt cut) {
  if (!propagatecutflags_[cut] &&
      (activitycutsinf_[cut] == 1 ||
       (cutpool->getRhs()[cut] - double(activitycuts_[cut]) <=
        capacityThreshold_[cut]))) {
    propagatecutinds_.push_back(cut);
    propagatecutflags_[cut] |= 1;
  }
}